

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::MethodOptions::~MethodOptions(MethodOptions *this)

{
  ulong uVar1;
  undefined8 *puVar2;
  
  uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if (puVar2 == (undefined8 *)0x0) {
    SharedDtor(this);
    internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>
              (&(this->super_Message).super_MessageLite._internal_metadata_);
  }
  RepeatedPtrField<google::protobuf::UninterpretedOption>::~RepeatedPtrField
            (&this->uninterpreted_option_);
  internal::ExtensionSet::~ExtensionSet(&this->_extensions_);
  MessageLite::~MessageLite((MessageLite *)this);
  return;
}

Assistant:

MethodOptions::~MethodOptions() {
  // @@protoc_insertion_point(destructor:google.protobuf.MethodOptions)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>();
}